

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void base64_encode(char *src,size_t srclen,char *out,size_t *outlen,int flags)

{
  undefined1 local_50 [8];
  base64_state state;
  size_t t;
  size_t s;
  size_t *psStack_28;
  int flags_local;
  size_t *outlen_local;
  char *out_local;
  size_t srclen_local;
  char *src_local;
  
  s._4_4_ = flags;
  psStack_28 = outlen;
  outlen_local = (size_t *)out;
  out_local = (char *)srclen;
  srclen_local = (size_t)src;
  base64_stream_encode_init((base64_state *)local_50,flags);
  base64_stream_encode
            ((base64_state *)local_50,(char *)srclen_local,(size_t)out_local,(char *)outlen_local,&t
            );
  base64_stream_encode_final
            ((base64_state *)local_50,(char *)((long)outlen_local + t),(size_t *)&state.flags);
  *psStack_28 = t + state._8_8_;
  return;
}

Assistant:

void
base64_encode
	( const char	*src
	, size_t	 srclen
	, char		*out
	, size_t	*outlen
	, int		 flags
	)
{
	size_t s;
	size_t t;
	struct base64_state state;

	#ifdef _OPENMP
	if (srclen >= OMP_THRESHOLD) {
		base64_encode_openmp(src, srclen, out, outlen, flags);
		return;
	}
	#endif

	// Init the stream reader:
	base64_stream_encode_init(&state, flags);

	// Feed the whole string to the stream reader:
	base64_stream_encode(&state, src, srclen, out, &s);

	// Finalize the stream by writing trailer if any:
	base64_stream_encode_final(&state, out + s, &t);

	// Final output length is stream length plus tail:
	*outlen = s + t;
}